

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.cpp
# Opt level: O0

void __thiscall StickyAssign_Construction_Test::TestBody(StickyAssign_Construction_Test *this)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  AssertHelper local_88;
  Message local_80;
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  sticky_assign<int> local_58;
  sticky_assign<int> explicit_init;
  Message local_48 [3];
  int local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  sticky_assign<int> default_init;
  StickyAssign_Construction_Test *this_local;
  
  pstore::serialize::sticky_assign<int>::sticky_assign((sticky_assign<int> *)&gtest_ar.message_);
  local_2c = 0;
  piVar2 = pstore::serialize::sticky_assign<int>::get((sticky_assign<int> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_28,"0","default_init.get ()",&local_2c,piVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&explicit_init,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_common.cpp"
               ,0x18,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&explicit_init,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&explicit_init);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x20;
  pstore::serialize::sticky_assign<int>::sticky_assign<int>
            (&local_58,
             (int *)((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_74 = 0x20;
  piVar2 = pstore::serialize::sticky_assign<int>::get(&local_58);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_70,"32","explicit_init.get ()",&local_74,piVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_common.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  return;
}

Assistant:

TEST (StickyAssign, Construction) {
    pstore::serialize::sticky_assign<int> default_init;
    EXPECT_EQ (0, default_init.get ());

    pstore::serialize::sticky_assign<int> explicit_init (32);
    EXPECT_EQ (32, explicit_init.get ());
}